

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v9::detail::write_significand<fmt::v9::appender,char>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point)

{
  long lVar1;
  appender aVar2;
  
  aVar2 = copy_str_noinline<char,char_const*,fmt::v9::appender>
                    (significand,significand + integral_size,out);
  if (decimal_point != '\0') {
    if (*(ulong *)((long)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container
                  + 0x18) <
        *(long *)((long)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
                 0x10) + 1U) {
      (*(code *)**(undefined8 **)
                  aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container)
                (aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container);
    }
    lVar1 = *(long *)((long)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                            container + 0x10);
    *(long *)((long)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container +
             0x10) = lVar1 + 1;
    *(char *)(*(long *)((long)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.
                              container + 8) + lVar1) = decimal_point;
    aVar2 = copy_str_noinline<char,char_const*,fmt::v9::appender>
                      (significand + integral_size,significand + significand_size,aVar2);
    return (appender)aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  }
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

FMT_CONSTEXPR auto write_significand(OutputIt out, const char* significand,
                                     int significand_size, int integral_size,
                                     Char decimal_point) -> OutputIt {
  out = detail::copy_str_noinline<Char>(significand,
                                        significand + integral_size, out);
  if (!decimal_point) return out;
  *out++ = decimal_point;
  return detail::copy_str_noinline<Char>(significand + integral_size,
                                         significand + significand_size, out);
}